

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O2

void __thiscall
draco::AttributeQuantizationTransform::GeneratePortableAttribute
          (AttributeQuantizationTransform *this,PointAttribute *attribute,int num_points,
          PointAttribute *target_attribute)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  pointer pIVar5;
  long lVar6;
  DataBuffer *pDVar7;
  size_t __n;
  pointer pfVar8;
  int32_t iVar9;
  Quantizer QVar10;
  uint uVar11;
  __uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true> __dest;
  ulong uVar12;
  long lVar13;
  int c;
  ulong uVar14;
  float fVar15;
  Quantizer quantizer;
  unique_ptr<float[],_std::default_delete<float[]>_> att_val;
  
  bVar1 = (attribute->super_GeometryAttribute).num_components_;
  iVar9 = this->quantization_bits_;
  lVar3 = (long)(((target_attribute->super_GeometryAttribute).buffer_)->data_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar4 = (target_attribute->super_GeometryAttribute).byte_offset_;
  Quantizer::Quantizer(&quantizer);
  Quantizer::Init(&quantizer,this->range_,~(-1 << ((byte)iVar9 & 0x1f)));
  __dest.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)operator_new__((ulong)bVar1 << 2);
  bVar2 = attribute->identity_mapping_;
  pIVar5 = (attribute->indices_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (attribute->super_GeometryAttribute).byte_offset_;
  pDVar7 = (attribute->super_GeometryAttribute).buffer_;
  __n = (attribute->super_GeometryAttribute).byte_stride_;
  lVar13 = 0;
  att_val._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
       __dest.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
       super__Head_base<0UL,_float_*,_false>._M_head_impl;
  for (uVar12 = 0; uVar12 != (uint)num_points; uVar12 = uVar12 + 1) {
    uVar11 = (uint)uVar12;
    if ((bVar2 & 1U) == 0) {
      uVar11 = pIVar5[uVar12].value_;
    }
    memcpy((void *)__dest.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl,
           (void *)((long)(pDVar7->data_).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar6 + uVar11 * __n),__n);
    QVar10 = quantizer;
    pfVar8 = (this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar14 = 0; bVar1 != uVar14; uVar14 = uVar14 + 1) {
      fVar15 = floorf((*(float *)((long)__dest.
                                        super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                        .super__Head_base<0UL,_float_*,_false>._M_head_impl +
                                 uVar14 * 4) - pfVar8[uVar14]) * QVar10.inverse_delta_ + 0.5);
      *(int *)(lVar3 + lVar4 + (long)(int)lVar13 * 4 + uVar14 * 4) = (int)fVar15;
    }
    lVar13 = (long)(int)lVar13 + uVar14;
  }
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&att_val);
  return;
}

Assistant:

void AttributeQuantizationTransform::GeneratePortableAttribute(
    const PointAttribute &attribute, int num_points,
    PointAttribute *target_attribute) const {
  DRACO_DCHECK(is_initialized());

  const int num_components = attribute.num_components();

  // Quantize all values using the order given by point_ids.
  int32_t *const portable_attribute_data = reinterpret_cast<int32_t *>(
      target_attribute->GetAddress(AttributeValueIndex(0)));
  const uint32_t max_quantized_value = (1 << (quantization_bits_)) - 1;
  Quantizer quantizer;
  quantizer.Init(range(), max_quantized_value);
  int32_t dst_index = 0;
  const std::unique_ptr<float[]> att_val(new float[num_components]);
  for (PointIndex i(0); i < num_points; ++i) {
    const AttributeValueIndex att_val_id = attribute.mapped_index(i);
    attribute.GetValue(att_val_id, att_val.get());
    for (int c = 0; c < num_components; ++c) {
      const float value = (att_val[c] - min_values()[c]);
      const int32_t q_val = quantizer.QuantizeFloat(value);
      portable_attribute_data[dst_index++] = q_val;
    }
  }
}